

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3VdbeMemNumerify(Mem *pMem)

{
  double dVar1;
  ushort uVar2;
  uint in_EAX;
  uint uVar3;
  int iVar4;
  sqlite3_int64 ix;
  MemValue local_10;
  
  if ((pMem->flags & 0x2d) != 0) goto LAB_00176b92;
  uVar3 = sqlite3AtoF(pMem->z,(double *)pMem,pMem->n,pMem->enc);
  if (uVar3 < 2) {
    iVar4 = sqlite3Atoi64(pMem->z,&local_10.i,pMem->n,pMem->enc);
    if (1 < iVar4) goto LAB_00176b25;
LAB_00176b73:
    pMem->u = local_10;
    uVar2 = 4;
  }
  else {
LAB_00176b25:
    dVar1 = (pMem->u).r;
    local_10.i = (i64)dVar1;
    if (((dVar1 == 0.0) && (!NAN(dVar1))) ||
       ((uVar2 = 8, 0xffe < (uint)((ulong)(local_10.i + -0x8000000000000) >> 0x34) &&
        (dVar1 == (double)local_10.i)))) goto LAB_00176b73;
  }
  in_EAX = (uint)uVar2 | pMem->flags & 0x3e40;
  pMem->flags = (u16)in_EAX;
LAB_00176b92:
  pMem->flags = pMem->flags & 0xbfed;
  return in_EAX;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemNumerify(Mem *pMem){
  testcase( pMem->flags & MEM_Int );
  testcase( pMem->flags & MEM_Real );
  testcase( pMem->flags & MEM_IntReal );
  testcase( pMem->flags & MEM_Null );
  if( (pMem->flags & (MEM_Int|MEM_Real|MEM_IntReal|MEM_Null))==0 ){
    int rc;
    sqlite3_int64 ix;
    assert( (pMem->flags & (MEM_Blob|MEM_Str))!=0 );
    assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
    rc = sqlite3AtoF(pMem->z, &pMem->u.r, pMem->n, pMem->enc);
    if( ((rc==0 || rc==1) && sqlite3Atoi64(pMem->z, &ix, pMem->n, pMem->enc)<=1)
     || sqlite3RealSameAsInt(pMem->u.r, (ix = (i64)pMem->u.r))
    ){
      pMem->u.i = ix;
      MemSetTypeFlag(pMem, MEM_Int);
    }else{
      MemSetTypeFlag(pMem, MEM_Real);
    }
  }
  assert( (pMem->flags & (MEM_Int|MEM_Real|MEM_IntReal|MEM_Null))!=0 );
  pMem->flags &= ~(MEM_Str|MEM_Blob|MEM_Zero);
  return SQLITE_OK;
}